

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O3

void __thiscall Application::printHelp(Application *this)

{
  ostream *poVar1;
  long *plVar2;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Keyboard actions :",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"* Escape      : Exit App",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"* H           : This help menu",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "* Right/Left  : Select next/previous joystick among the FF capable detected ones",0x50
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"* Up/Down     : Select next/previous effect for the selected joystick",0x45);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"* PgUp/PgDn   : Increase/decrease from 5% the master gain ",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"for all the joysticks",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"* Space       : Toggle auto-centering on all the joysticks",0x3a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (this->_bIsInitialized == true) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Implemented effects :",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    EffectManager::printEffects(this->_pEffectMgr);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void printHelp()
	{
		cout << endl
			 << "Keyboard actions :" << endl
			 << "* Escape      : Exit App" << endl
			 << "* H           : This help menu" << endl
			 << "* Right/Left  : Select next/previous joystick among the FF capable detected ones" << endl
			 << "* Up/Down     : Select next/previous effect for the selected joystick" << endl
			 << "* PgUp/PgDn   : Increase/decrease from 5% the master gain "
			 << "for all the joysticks" << endl
			 << "* Space       : Toggle auto-centering on all the joysticks" << endl;
		if(_bIsInitialized)
		{
			cout << endl
				 << "Implemented effects :" << endl
				 << endl;
			_pEffectMgr->printEffects();
			cout << endl;
		}
	}